

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# aalcalcmeanonly.cpp
# Opt level: O3

void aalcalcmeanonly::LoadOccurrence<occurrence_granular>(occurrence_granular *occ,FILE *fin)

{
  undefined8 uVar1;
  size_t sVar2;
  iterator iVar3;
  mapped_type *pmVar4;
  mapped_type *pmVar5;
  int iVar6;
  FILE *__stream;
  FILE *__k;
  FILE *__stream_00;
  undefined1 *unaff_R12;
  undefined1 *unaff_R13;
  int *__k_00;
  bool bVar7;
  undefined4 uVar8;
  double dVar9;
  double dVar10;
  undefined1 auVar11 [16];
  int iStack_e4;
  float fStack_e0;
  key_type kStack_dc;
  key_type akStack_d8 [2];
  mapped_type mStack_d0;
  double dStack_c8;
  FILE *pFStack_c0;
  undefined1 *puStack_b8;
  undefined1 *puStack_b0;
  FILE *pFStack_a8;
  int *piStack_a0;
  undefined1 auVar12 [16];
  
  fread(&nPeriods_,4,1,(FILE *)fin);
  uVar1 = periodToWeighting_._24_8_;
  if (periodToWeighting_._24_8_ == 0) {
    dVar9 = 1.0;
  }
  else {
    dVar9 = 0.0;
  }
  __stream = (FILE *)0x10;
  __k = (FILE *)occ;
  sVar2 = fread(occ,0x10,1,(FILE *)fin);
  if (sVar2 != 0) {
    auVar11._8_4_ = SUB84(uVar1,4);
    auVar11._0_8_ = uVar1;
    auVar11._12_4_ = 0x45300000;
    unaff_R12 = periodToWeighting_;
    unaff_R13 = eventToWeighting_;
    do {
      iVar3 = std::
              _Hashtable<int,_std::pair<const_int,_double>,_std::allocator<std::pair<const_int,_double>_>,_std::__detail::_Select1st,_std::equal_to<int>,_std::hash<int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>_>
              ::find((_Hashtable<int,_std::pair<const_int,_double>,_std::allocator<std::pair<const_int,_double>_>,_std::__detail::_Select1st,_std::equal_to<int>,_std::hash<int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>_>
                      *)periodToWeighting_,&occ->period_no);
      dVar10 = dVar9;
      if (iVar3.super__Node_iterator_base<std::pair<const_int,_double>,_false>._M_cur !=
          (__node_type *)0x0) {
        pmVar4 = std::__detail::
                 _Map_base<int,_std::pair<const_int,_double>,_std::allocator<std::pair<const_int,_double>_>,_std::__detail::_Select1st,_std::equal_to<int>,_std::hash<int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
                 ::operator[]((_Map_base<int,_std::pair<const_int,_double>,_std::allocator<std::pair<const_int,_double>_>,_std::__detail::_Select1st,_std::equal_to<int>,_std::hash<int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
                               *)periodToWeighting_,&occ->period_no);
        dVar10 = *pmVar4 * ((auVar11._8_8_ - 1.9342813113834067e+25) +
                           ((double)CONCAT44(0x43300000,(int)uVar1) - 4503599627370496.0));
      }
      pmVar4 = std::__detail::
               _Map_base<int,_std::pair<const_int,_double>,_std::allocator<std::pair<const_int,_double>_>,_std::__detail::_Select1st,_std::equal_to<int>,_std::hash<int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
               ::operator[]((_Map_base<int,_std::pair<const_int,_double>,_std::allocator<std::pair<const_int,_double>_>,_std::__detail::_Select1st,_std::equal_to<int>,_std::hash<int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
                             *)eventToWeighting_,&occ->event_id);
      *pmVar4 = dVar10 + *pmVar4;
      if (maxPeriodNo_ < occ->period_no) {
        maxPeriodNo_ = occ->period_no;
      }
      __stream = (FILE *)0x10;
      __k = (FILE *)occ;
      sVar2 = fread(occ,0x10,1,(FILE *)fin);
    } while (sVar2 != 0);
  }
  if (maxPeriodNo_ <= nPeriods_) {
    fclose((FILE *)fin);
    return;
  }
  LoadOccurrence<occurrence_granular>();
  fread(&nPeriods_,4,1,__stream);
  __k_00 = (int *)periodToWeighting_._24_8_;
  if (periodToWeighting_._24_8_ == 0) {
    dVar9 = 1.0;
  }
  else {
    dVar9 = 0.0;
  }
  __stream_00 = __k;
  sVar2 = fread(__k,0xc,1,__stream);
  if (sVar2 != 0) {
    auVar12._8_4_ = SUB84(__k_00,4);
    auVar12._0_8_ = __k_00;
    auVar12._12_4_ = 0x45300000;
    uVar8 = SUB84(__k_00,0);
    __k_00 = (int *)&__k->field_0x4;
    unaff_R12 = periodToWeighting_;
    unaff_R13 = eventToWeighting_;
    do {
      iVar3 = std::
              _Hashtable<int,_std::pair<const_int,_double>,_std::allocator<std::pair<const_int,_double>_>,_std::__detail::_Select1st,_std::equal_to<int>,_std::hash<int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>_>
              ::find((_Hashtable<int,_std::pair<const_int,_double>,_std::allocator<std::pair<const_int,_double>_>,_std::__detail::_Select1st,_std::equal_to<int>,_std::hash<int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>_>
                      *)periodToWeighting_,__k_00);
      dVar10 = dVar9;
      if (iVar3.super__Node_iterator_base<std::pair<const_int,_double>,_false>._M_cur !=
          (__node_type *)0x0) {
        pmVar4 = std::__detail::
                 _Map_base<int,_std::pair<const_int,_double>,_std::allocator<std::pair<const_int,_double>_>,_std::__detail::_Select1st,_std::equal_to<int>,_std::hash<int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
                 ::operator[]((_Map_base<int,_std::pair<const_int,_double>,_std::allocator<std::pair<const_int,_double>_>,_std::__detail::_Select1st,_std::equal_to<int>,_std::hash<int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
                               *)periodToWeighting_,__k_00);
        dVar10 = *pmVar4 * ((auVar12._8_8_ - 1.9342813113834067e+25) +
                           ((double)CONCAT44(0x43300000,uVar8) - 4503599627370496.0));
      }
      pmVar4 = std::__detail::
               _Map_base<int,_std::pair<const_int,_double>,_std::allocator<std::pair<const_int,_double>_>,_std::__detail::_Select1st,_std::equal_to<int>,_std::hash<int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
               ::operator[]((_Map_base<int,_std::pair<const_int,_double>,_std::allocator<std::pair<const_int,_double>_>,_std::__detail::_Select1st,_std::equal_to<int>,_std::hash<int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
                             *)eventToWeighting_,&__k->_flags);
      *pmVar4 = dVar10 + *pmVar4;
      if (maxPeriodNo_ < *(int *)&__k->field_0x4) {
        maxPeriodNo_ = *(int *)&__k->field_0x4;
      }
      __stream_00 = __k;
      sVar2 = fread(__k,0xc,1,__stream);
    } while (sVar2 != 0);
  }
  if (maxPeriodNo_ <= nPeriods_) {
    fclose(__stream);
    return;
  }
  LoadOccurrence<occurrence>();
  pFStack_c0 = __stream;
  puStack_b8 = unaff_R12;
  puStack_b0 = unaff_R13;
  pFStack_a8 = __k;
  piStack_a0 = __k_00;
  sVar2 = fread(&kStack_dc,0xc,1,__stream_00);
  if (sVar2 != 0) {
    do {
      pmVar4 = std::__detail::
               _Map_base<int,_std::pair<const_int,_double>,_std::allocator<std::pair<const_int,_double>_>,_std::__detail::_Select1st,_std::equal_to<int>,_std::hash<int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
               ::operator[]((_Map_base<int,_std::pair<const_int,_double>,_std::allocator<std::pair<const_int,_double>_>,_std::__detail::_Select1st,_std::equal_to<int>,_std::hash<int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
                             *)eventToWeighting_,&kStack_dc);
      mStack_d0 = *pmVar4;
      do {
        sVar2 = fread(&iStack_e4,8,1,__stream_00);
        if (1 < iStack_e4 + 5U) {
          if ((sVar2 == 0) || (iStack_e4 == 0)) break;
          bVar7 = iStack_e4 != -1;
          iVar6 = 1;
          if (bVar7) {
            iVar6 = sampleSize_;
          }
          dStack_c8 = ((double)fStack_e0 * mStack_d0) / (double)iVar6;
          pmVar5 = std::
                   map<int,_std::array<double,_2UL>,_std::less<int>,_std::allocator<std::pair<const_int,_std::array<double,_2UL>_>_>_>
                   ::operator[]((map<int,_std::array<double,_2UL>,_std::less<int>,_std::allocator<std::pair<const_int,_std::array<double,_2UL>_>_>_>
                                 *)means_,akStack_d8);
          pmVar5->_M_elems[bVar7] = dStack_c8 + pmVar5->_M_elems[bVar7];
        }
      } while (sVar2 != 0);
      sVar2 = fread(&kStack_dc,0xc,1,__stream_00);
    } while (sVar2 != 0);
  }
  return;
}

Assistant:

void LoadOccurrence(T &occ, FILE *fin) {

    size_t i = fread(&nPeriods_, sizeof(nPeriods_), 1, fin);
    double factor = (double)periodToWeighting_.size();
    double defaultWeighting = 1.0;
    if (periodToWeighting_.size() > 0) defaultWeighting = 0.0;

    i = fread(&occ, sizeof(occ), 1, fin);
    while (i != 0) {
      double weighting = defaultWeighting;
      if (periodToWeighting_.find(occ.period_no) != periodToWeighting_.end()) {
	weighting = periodToWeighting_[occ.period_no] * factor;
      }
      eventToWeighting_[occ.event_id] += weighting;
      if (maxPeriodNo_ < occ.period_no) maxPeriodNo_ = occ.period_no;
      i = fread(&occ, sizeof(occ), 1, fin);
    }

    if (maxPeriodNo_ > nPeriods_) {
      fprintf(stderr,
	      "FATAL: Maximum period number exceeds total number of periods in header of %s\n",
	      OCCURRENCE_FILE);
      exit(EXIT_FAILURE);
    }

    fclose(fin);

  }